

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandOrPos(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  char *pcVar4;
  uint fXor;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fXor = 0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  while( true ) {
    do {
      iVar2 = Extra_UtilGetopt(argc,argv,"rxh");
    } while (iVar2 == 99);
    if (iVar2 == -1) break;
    if (iVar2 == 0x78) {
      fXor = fXor ^ 1;
    }
    else {
      if (iVar2 != 0x72) {
        Abc_Print(-2,"usage: orpos [-rxh]\n");
        Abc_Print(-2,
                  "\t        creates single-output miter by ORing the POs of the current network\n")
        ;
        pcVar4 = "yes";
        pcVar3 = "yes";
        if (!bVar1) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-r    : performs the reverse transform (OR decomposition) [default = %s]\n",
                  pcVar3);
        if (fXor == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-x    : toggles combining the PO using XOR [default = %s]\n",pcVar4);
        pcVar3 = "\t-h    : print the command usage\n";
        iVar2 = -2;
LAB_00257372:
        Abc_Print(iVar2,pcVar3);
        return 1;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Empty network.\n";
  }
  else if (pNtk->ntkType == ABC_NTK_STRASH) {
    if (bVar1) {
      pMan = Abc_NtkToDarBmc(pNtk,(Vec_Int_t **)0x0);
      pNtk_00 = Abc_NtkFromAigPhase(pMan);
      Aig_ManStop(pMan);
      if (pNtk->vPos->nSize == pNtk_00->vPos->nSize) {
        Abc_Print(1,"The output(s) cannot be structurally decomposed.\n");
      }
      else {
        Abc_Print(1,"Expanded %d outputs into %d outputs using OR decomposition.\n");
      }
      if (pAbc->pCex != (Abc_Cex_t *)0x0) {
        free(pAbc->pCex);
        pAbc->pCex = (Abc_Cex_t *)0x0;
      }
      if (pNtk_00->pName != (char *)0x0) {
        free(pNtk_00->pName);
        pNtk_00->pName = (char *)0x0;
      }
      pcVar3 = Extra_UtilStrsav(pNtk->pName);
      pNtk_00->pName = pcVar3;
      Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
      return 0;
    }
    iVar2 = Abc_NtkCombinePos(pNtk,0,fXor);
    if (iVar2 != 0) {
      if (pAbc->pCex == (Abc_Cex_t *)0x0) {
        return 0;
      }
      pAbc->pCex->iPo = 0;
      return 0;
    }
    pcVar3 = "ORing the POs has failed.\n";
  }
  else {
    pcVar3 = "The network is not strashed.\n";
  }
  iVar2 = -1;
  goto LAB_00257372;
}

Assistant:

int Abc_CommandOrPos( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);//, * pNtkRes;
    int fReverse = 0;
    int fComb = 0;
    int fXor = 0;
    int c;
    extern int Abc_NtkCombinePos( Abc_Ntk_t * pNtk, int fAnd, int fXor );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rxh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fReverse ^= 1;
            break;
        case 'x':
            fXor ^= 1;
            break;
        case 'c':
            fComb ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "The network is not strashed.\n" );
        return 1;
    }
    // get the new network
    if ( fReverse )
    {
        extern Aig_Man_t * Abc_NtkToDarBmc( Abc_Ntk_t * pNtk, Vec_Int_t ** pvMap );
        Aig_Man_t * pMan = Abc_NtkToDarBmc( pNtk, NULL );
        Abc_Ntk_t * pNtkRes = Abc_NtkFromAigPhase( pMan );
        Aig_ManStop( pMan );
        // perform expansion
        if ( Abc_NtkPoNum(pNtk) != Abc_NtkPoNum(pNtkRes) )
            Abc_Print( 1,"Expanded %d outputs into %d outputs using OR decomposition.\n", Abc_NtkPoNum(pNtk), Abc_NtkPoNum(pNtkRes) );
        else
            Abc_Print( 1,"The output(s) cannot be structurally decomposed.\n" );
        // clear counter-example
        if ( pAbc->pCex )
            ABC_FREE( pAbc->pCex );
        // replace the current network
        ABC_FREE( pNtkRes->pName );
        pNtkRes->pName = Extra_UtilStrsav(pNtk->pName);
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    }
    else
    {
        if ( !Abc_NtkCombinePos( pNtk, 0, fXor ) )
        {
            Abc_Print( -1, "ORing the POs has failed.\n" );
            return 1;
        }
        // update counter-example
        if ( pAbc->pCex )
            pAbc->pCex->iPo = 0;
        // replace the current network
    //    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: orpos [-rxh]\n" );
    Abc_Print( -2, "\t        creates single-output miter by ORing the POs of the current network\n" );
    Abc_Print( -2, "\t-r    : performs the reverse transform (OR decomposition) [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-x    : toggles combining the PO using XOR [default = %s]\n", fXor? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}